

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

void __thiscall
TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test::
~TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test
          (TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test *this)

{
  TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test *this_local;
  
  ~TEST_TestFailure_StringsEqualNoCaseFailureWithText_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestFailure, StringsEqualNoCaseFailureWithText)
{
    StringEqualNoCaseFailure f(test, failFileName, failLineNumber, "ABC", "abd", "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <ABC>\n"
                  "\tbut was  <abd>\n"
                  "\tdifference starts at position 2 at: <        abd         >\n"
                  "\t                                               ^", f);
}